

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subtree.c
# Opt level: O2

size_t ts_subtree__write_to_string
                 (Subtree self,char *string,size_t limit,TSLanguage *language,_Bool is_root,
                 _Bool include_all,TSSymbol alias_symbol,_Bool alias_is_named)

{
  Subtree self_00;
  _Bool _Var1;
  ushort alias_symbol_00;
  uint uVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  ushort **ppuVar6;
  char *pcVar7;
  char *pcVar8;
  ulong uVar9;
  char *pcVar10;
  char cVar11;
  ulong uVar12;
  TSSymbol *local_38;
  
  if (self.ptr == (SubtreeHeapData *)0x0) {
    iVar3 = snprintf(string,limit,"(NULL)");
    return (long)iVar3;
  }
  cVar11 = '\x01';
  if ((!is_root && !include_all) && (_Var1 = ts_subtree_missing(self), !_Var1)) {
    if (((ulong)self.ptr & 1) == 0) {
      uVar2 = (uint)*(ushort *)&(self.ptr)->field_0x2c;
    }
    else {
      uVar2 = (uint)((ulong)self.ptr >> 1) & 0x7fffffff;
    }
    if (((uVar2 & 1) == 0) || (_Var1 = ts_subtree_named(self), !_Var1)) {
      cVar11 = alias_is_named;
    }
  }
  pcVar10 = string;
  if (cVar11 == '\x01' && !is_root) {
    iVar3 = snprintf(string,limit," ");
    pcVar10 = string + iVar3;
  }
  if (cVar11 == '\0') {
    if (((ulong)self.ptr & 1) != 0) goto LAB_0011a1b9;
LAB_0011a057:
    uVar2 = (self.ptr)->child_count;
    if (uVar2 != 0) {
      uVar9 = (ulong)((self.ptr)->field_17).field_0.alias_sequence_id;
      uVar12 = 0;
      if (uVar9 == 0) {
        local_38 = (TSSymbol *)0x0;
      }
      else {
        local_38 = language->alias_sequences + language->max_alias_sequence_length * uVar9;
      }
      for (uVar9 = 0; uVar9 < uVar2; uVar9 = uVar9 + 1) {
        self_00 = ((self.ptr)->field_17).field_0.children[uVar9];
        _Var1 = ts_subtree_extra(self_00);
        if (_Var1) {
          pcVar7 = pcVar10;
          if (limit == 0) {
            pcVar7 = string;
          }
          sVar5 = ts_subtree__write_to_string
                            (self_00,pcVar7,limit,language,false,include_all,0,false);
        }
        else {
          pcVar7 = pcVar10;
          if (local_38 == (TSSymbol *)0x0) {
            if (limit == 0) {
              pcVar7 = string;
            }
            alias_symbol_00 = 0;
            _Var1 = false;
          }
          else {
            alias_symbol_00 = local_38[uVar12];
            if (limit == 0) {
              pcVar7 = string;
            }
            _Var1 = false;
            if ((alias_symbol_00 != 0) && (_Var1 = false, alias_symbol_00 != 0xfffe)) {
              if (alias_symbol_00 == 0xffff) {
                _Var1 = true;
              }
              else {
                _Var1 = (_Bool)(((byte)language->symbol_metadata[alias_symbol_00] & 2) >> 1);
              }
            }
          }
          sVar5 = ts_subtree__write_to_string
                            (self_00,pcVar7,limit,language,false,include_all,alias_symbol_00,_Var1);
          uVar12 = (ulong)((int)uVar12 + 1);
        }
        pcVar10 = pcVar10 + sVar5;
        uVar2 = (self.ptr)->child_count;
      }
    }
    if (cVar11 == '\0') goto LAB_0011a1b9;
  }
  else {
    if ((((((ulong)self.ptr & 1) == 0) && ((self.ptr)->symbol == 0xffff)) &&
        ((self.ptr)->child_count == 0)) && (((self.ptr)->size).bytes != 0)) {
      pcVar7 = pcVar10;
      if (limit == 0) {
        pcVar7 = string;
      }
      iVar3 = snprintf(pcVar7,limit,"(UNEXPECTED ");
      pcVar7 = pcVar10 + iVar3;
      if (limit == 0) {
        pcVar7 = string;
      }
      uVar2 = ((self.ptr)->field_17).lookahead_char;
      uVar9 = (ulong)uVar2;
      if (uVar9 == 0xffffffff) {
        pcVar8 = "INVALID";
LAB_0011a27c:
        iVar4 = snprintf(pcVar7,limit,pcVar8);
      }
      else {
        if (uVar2 == 0xd) {
          pcVar8 = "\'\\r\'";
          goto LAB_0011a27c;
        }
        if (uVar2 == 9) {
          pcVar8 = "\'\\t\'";
          goto LAB_0011a27c;
        }
        if (uVar2 == 10) {
          pcVar8 = "\'\\n\'";
          goto LAB_0011a27c;
        }
        if (uVar2 == 0) {
          pcVar8 = "EOF";
          goto LAB_0011a27c;
        }
        if ((uVar2 < 0x80) &&
           (ppuVar6 = __ctype_b_loc(), (*(byte *)((long)*ppuVar6 + uVar9 * 2 + 1) & 0x40) != 0)) {
          pcVar8 = "consume character:\'%c\'";
        }
        else {
          pcVar8 = "consume character:%d";
        }
        iVar4 = snprintf(pcVar7,limit,pcVar8 + 0x12,uVar9);
      }
      pcVar10 = pcVar10 + iVar3 + iVar4;
      goto LAB_0011a057;
    }
    _Var1 = ts_subtree_missing(self);
    if (_Var1) {
      pcVar7 = pcVar10;
      if (limit == 0) {
        pcVar7 = string;
      }
      iVar3 = snprintf(pcVar7,limit,"(MISSING");
    }
    else {
      if (alias_symbol == 0) {
        if (((ulong)self.ptr & 1) == 0) {
          alias_symbol = (self.ptr)->symbol;
        }
        else {
          alias_symbol = (TSSymbol)self.data.symbol;
        }
      }
      if (alias_symbol == 0xffff) {
        pcVar7 = "ERROR";
      }
      else if (alias_symbol == 0xfffe) {
        pcVar7 = "_ERROR";
      }
      else {
        pcVar7 = language->symbol_names[alias_symbol];
      }
      pcVar8 = pcVar10;
      if (limit == 0) {
        pcVar8 = string;
      }
      iVar3 = snprintf(pcVar8,limit,"(%s",pcVar7);
    }
    pcVar10 = pcVar10 + iVar3;
    if (((ulong)self.ptr & 1) == 0) goto LAB_0011a057;
  }
  pcVar7 = pcVar10;
  if (limit == 0) {
    pcVar7 = string;
  }
  iVar3 = snprintf(pcVar7,limit,")");
  pcVar10 = pcVar10 + iVar3;
LAB_0011a1b9:
  return (long)pcVar10 - (long)string;
}

Assistant:

static size_t ts_subtree__write_to_string(Subtree self, char *string, size_t limit,
                                          const TSLanguage *language, bool is_root,
                                          bool include_all, TSSymbol alias_symbol,
                                          bool alias_is_named) {
  if (!self.ptr) return snprintf(string, limit, "(NULL)");

  char *cursor = string;
  char **writer = (limit > 0) ? &cursor : &string;
  bool visible =
    include_all ||
    is_root ||
    ts_subtree_missing(self) ||
    (ts_subtree_visible(self) && ts_subtree_named(self)) ||
    alias_is_named;

  if (visible && !is_root) {
    cursor += snprintf(*writer, limit, " ");
  }

  if (visible) {
    if (ts_subtree_is_error(self) && ts_subtree_child_count(self) == 0 && self.ptr->size.bytes > 0) {
      cursor += snprintf(*writer, limit, "(UNEXPECTED ");
      cursor += ts_subtree__write_char_to_string(*writer, limit, self.ptr->lookahead_char);
    } else if (ts_subtree_missing(self)) {
      cursor += snprintf(*writer, limit, "(MISSING");
    } else {
      TSSymbol symbol = alias_symbol ? alias_symbol : ts_subtree_symbol(self);
      const char *symbol_name = ts_language_symbol_name(language, symbol);
      cursor += snprintf(*writer, limit, "(%s", symbol_name);
    }
  }

  if (ts_subtree_child_count(self)) {
    const TSSymbol *alias_sequence = ts_language_alias_sequence(language, self.ptr->alias_sequence_id);
    uint32_t structural_child_index = 0;
    for (uint32_t i = 0; i < self.ptr->child_count; i++) {
      Subtree child = self.ptr->children[i];
      if (ts_subtree_extra(child)) {
        cursor += ts_subtree__write_to_string(
          child, *writer, limit,
          language, false, include_all,
          0, false
        );
      } else {
        TSSymbol alias_symbol = alias_sequence ? alias_sequence[structural_child_index] : 0;
        cursor += ts_subtree__write_to_string(
          child, *writer, limit,
          language, false, include_all,
          alias_symbol,
          alias_symbol ? ts_language_symbol_metadata(language, alias_symbol).named : false
        );
        structural_child_index++;
      }
    }
  }

  if (visible) cursor += snprintf(*writer, limit, ")");

  return cursor - string;
}